

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-join.c
# Opt level: O0

int run_test_udp_multicast_join(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  undefined1 local_20 [8];
  sockaddr_in addr;
  int r;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,local_20);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join.c"
            ,0x90,"0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT, &addr)");
    abort();
  }
  uVar2 = uv_default_loop();
  addr.sin_zero._0_4_ = uv_udp_init(uVar2,&server);
  if (addr.sin_zero._0_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join.c"
            ,0x93,"r == 0");
    abort();
  }
  uVar2 = uv_default_loop();
  addr.sin_zero._0_4_ = uv_udp_init(uVar2,&client);
  if (addr.sin_zero._0_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join.c"
            ,0x96,"r == 0");
    abort();
  }
  addr.sin_zero._0_4_ = uv_udp_bind(&server,local_20,0);
  if (addr.sin_zero._0_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join.c"
            ,0x9a,"r == 0");
    abort();
  }
  addr.sin_zero._0_4_ = uv_udp_set_membership(&server,"239.255.0.1",0,1);
  if (addr.sin_zero._0_4_ == -0x13) {
    fprintf(_stderr,"%s\n","No multicast support.");
    fflush(_stderr);
    addr.sin_zero[4] = '\x01';
    addr.sin_zero[5] = '\0';
    addr.sin_zero[6] = '\0';
    addr.sin_zero[7] = '\0';
  }
  else {
    if (addr.sin_zero._0_4_ != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join.c"
              ,0xa0,"r == 0");
      abort();
    }
    addr.sin_zero._0_4_ = uv_udp_recv_start(&server,alloc_cb,cl_recv_cb);
    if (addr.sin_zero._0_4_ != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join.c"
              ,0xa3,"r == 0");
      abort();
    }
    addr.sin_zero._0_4_ = do_send(&req);
    if (addr.sin_zero._0_4_ != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join.c"
              ,0xa6,"r == 0");
      abort();
    }
    if (close_cb_called != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join.c"
              ,0xa8,"close_cb_called == 0");
      abort();
    }
    if (cl_recv_cb_called != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join.c"
              ,0xa9,"cl_recv_cb_called == 0");
      abort();
    }
    if (sv_send_cb_called != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join.c"
              ,0xaa,"sv_send_cb_called == 0");
      abort();
    }
    uVar2 = uv_default_loop();
    uv_run(uVar2,0);
    if (cl_recv_cb_called != 2) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join.c"
              ,0xaf,"cl_recv_cb_called == 2");
      abort();
    }
    if (sv_send_cb_called != 2) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join.c"
              ,0xb0,"sv_send_cb_called == 2");
      abort();
    }
    if (close_cb_called != 2) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join.c"
              ,0xb1,"close_cb_called == 2");
      abort();
    }
    loop = (uv_loop_t *)uv_default_loop();
    close_loop(loop);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join.c"
              ,0xb3,"0 == uv_loop_close(uv_default_loop())");
      abort();
    }
    uv_library_shutdown();
    addr.sin_zero[4] = '\0';
    addr.sin_zero[5] = '\0';
    addr.sin_zero[6] = '\0';
    addr.sin_zero[7] = '\0';
  }
  iVar1._0_1_ = addr.sin_zero[4];
  iVar1._1_1_ = addr.sin_zero[5];
  iVar1._2_1_ = addr.sin_zero[6];
  iVar1._3_1_ = addr.sin_zero[7];
  return iVar1;
}

Assistant:

TEST_IMPL(udp_multicast_join) {
  int r;
  struct sockaddr_in addr;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  /* bind to the desired port */
  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  /* join the multicast channel */
  r = uv_udp_set_membership(&server, MULTICAST_ADDR, NULL, UV_JOIN_GROUP);
  if (r == UV_ENODEV)
    RETURN_SKIP("No multicast support.");
  ASSERT(r == 0);

  r = uv_udp_recv_start(&server, alloc_cb, cl_recv_cb);
  ASSERT(r == 0);

  r = do_send(&req);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(cl_recv_cb_called == 0);
  ASSERT(sv_send_cb_called == 0);

  /* run the loop till all events are processed */
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(cl_recv_cb_called == 2);
  ASSERT(sv_send_cb_called == 2);
  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}